

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_el.h
# Opt level: O3

RefEl __thiscall lf::base::RefEl::SubType(RefEl *this,dim_t sub_codim,dim_t sub_index)

{
  RefElType type;
  dim_t dVar1;
  size_type sVar2;
  runtime_error *this_00;
  
  dVar1 = internal::DimensionImpl(this->type_);
  if (dVar1 < sub_codim) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"sub_codim > Dimension()");
  }
  else {
    sVar2 = NumSubEntities(this,sub_codim);
    if (sub_index < sVar2) {
      type = this->type_;
      if (sub_codim != 0) {
        dVar1 = internal::DimensionImpl(type);
        type = kPoint;
        if (dVar1 != sub_codim) {
          dVar1 = internal::DimensionImpl(this->type_);
          type = kSegment;
          if (dVar1 - sub_codim != 1) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"This code should never be reached.");
            goto LAB_00141ebd;
          }
        }
      }
      return (RefEl)type;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"sub_index >= NumSubEntities");
  }
LAB_00141ebd:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

[[nodiscard]] constexpr RefEl SubType(dim_t sub_codim,
                                        dim_t sub_index) const {
    LF_ASSERT_MSG_CONSTEXPR(sub_codim >= 0, "sub_codim is negative");
    LF_ASSERT_MSG_CONSTEXPR(sub_codim <= Dimension(),
                            "sub_codim > Dimension()");
    LF_ASSERT_MSG_CONSTEXPR(sub_index >= 0, "sub_index is negative");
    LF_ASSERT_MSG_CONSTEXPR(sub_index < NumSubEntities(sub_codim),
                            "sub_index >= NumSubEntities");

    if (sub_codim == 0) {
      return *this;
    }
    if (sub_codim == Dimension()) {
      return kPoint();
    }
    if (Dimension() - sub_codim == 1) {
      return kSegment();
    } else {  // NOLINT(readability-else-after-return)
      LF_ASSERT_MSG_CONSTEXPR(false, "This code should never be reached.");
    }

    return kPoint();  // prevent warnings from compiler
  }